

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O0

void __thiscall
capnp::_::ShiftingWireValue<unsigned_int,_4UL>::set
          (ShiftingWireValue<unsigned_int,_4UL> *this,uint newValue)

{
  uint32_t raw;
  uint newValue_local;
  ShiftingWireValue<unsigned_int,_4UL> *this_local;
  
  (this->field_0).bytes[0] = (byte)newValue;
  (this->field_0).bytes[1] = (byte)(newValue >> 8);
  (this->field_0).bytes[2] = (byte)(newValue >> 0x10);
  (this->field_0).bytes[3] = (byte)(newValue >> 0x18);
  return;
}

Assistant:

KJ_ALWAYS_INLINE(void set(T newValue)) {
    uint32_t raw;
    memcpy(&raw, &newValue, sizeof(T));
    bytes[0] = raw;
    bytes[1] = raw >> 8;
    bytes[2] = raw >> 16;
    bytes[3] = raw >> 24;
  }